

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perf.c
# Opt level: O3

int parse_int(char *arg,char *what)

{
  ulong uVar1;
  char *local_20;
  char *eptr;
  
  uVar1 = strtol(arg,&local_20,10);
  if (((uVar1 < 0x3b9aca01) && (local_20 != arg)) && (*local_20 == '\0')) {
    return (int)uVar1;
  }
  die("Invalid %s",what);
}

Assistant:

static int
parse_int(const char *arg, const char *what)
{
	long  val;
	char *eptr;

	val = strtol(arg, &eptr, 10);
	// Must be a positive number less than around a billion.
	if ((val < 0) || (val > 1000000000) || (*eptr != 0) || (eptr == arg)) {
		die("Invalid %s", what);
	}
	return ((int) val);
}